

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

ssize_t clickhouse::Poll(pollfd *fds,int nfds,int timeout)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  pollfd *in_RDI;
  
  iVar1 = poll(in_RDI,(long)in_ESI,in_EDX);
  return (long)iVar1;
}

Assistant:

ssize_t Poll(struct pollfd* fds, int nfds, int timeout) noexcept {
#if defined(_win_)
    int rval = WSAPoll(fds, nfds, timeout);
#else
    return poll(fds, nfds, timeout);
#endif
    return -1;
}